

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IM_Command.h
# Opt level: O2

void __thiscall nigel::IM_Block::IM_Block(IM_Block *this,String *symbol,bool begin)

{
  (this->super_IM_Operator).super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_IM_Operator).super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)&(this->super_IM_Operator).type = 3;
  (this->super_IM_Operator)._vptr_IM_Operator = (_func_int **)&PTR__IM_Block_0019a588;
  (this->symbol)._M_dataplus._M_p = (pointer)&(this->symbol).field_2;
  (this->symbol)._M_string_length = 0;
  (this->symbol).field_2._M_local_buf[0] = '\0';
  this->begin = false;
  this->finish = false;
  std::__cxx11::string::_M_assign((string *)&this->symbol);
  this->begin = begin;
  return;
}

Assistant:

IM_Block( String symbol, bool begin ) : IM_Operator( IM_Operator::Type::block )
		{
			this->symbol = symbol;
			this->begin = begin;
		}